

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O1

void Abc_NtkVectorPrintVars(Abc_Ntk_t *pNtk,Vec_Int_t *vPiValues,int nPars)

{
  ulong uVar1;
  
  if (nPars < pNtk->vPis->nSize) {
    uVar1 = (ulong)(uint)nPars;
    do {
      if ((nPars < 0) || (vPiValues->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      printf("%d",(ulong)(uint)vPiValues->pArray[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((int)uVar1 < pNtk->vPis->nSize);
  }
  return;
}

Assistant:

void Abc_NtkVectorPrintVars( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues, int nPars )
{
    int i;
    for ( i = nPars; i < Abc_NtkPiNum(pNtk); i++ )
        printf( "%d", Vec_IntEntry(vPiValues,i) );
}